

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void __thiscall cppcms::xss::basic_rules_holder::add_entity(basic_rules_holder *this,string *name)

{
  undefined1 local_40 [48];
  
  details::c_string::c_string((c_string *)local_40,name);
  std::
  _Rb_tree<cppcms::xss::details::c_string,_cppcms::xss::details::c_string,_std::_Identity<cppcms::xss::details::c_string>,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
  ::_M_insert_unique<cppcms::xss::details::c_string>(&(this->entities)._M_t,(c_string *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void add_entity(std::string const &name)
		{
			entities.insert(c_string(name));
		}